

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O1

void __thiscall PrintMenu::act(PrintMenu *this,Restaurant *restaurant)

{
  pointer pDVar1;
  DishType type;
  int iVar2;
  vector<Dish,_std::allocator<Dish>_> *pvVar3;
  ostream *poVar4;
  PrintMenu *this_00;
  pointer this_01;
  string local_70;
  string local_50;
  
  pvVar3 = Restaurant::getMenu(restaurant);
  this_01 = (pvVar3->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pDVar1 = (pvVar3->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  if (this_01 != pDVar1) {
    do {
      Dish::getName_abi_cxx11_(&local_50,this_01);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      this_00 = (PrintMenu *)0x10d262;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      type = Dish::getType(this_01);
      findMyType_abi_cxx11_(&local_70,this_00,type);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      iVar2 = Dish::getPrice(this_01);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"NIS \n",5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      this_01 = this_01 + 1;
    } while (this_01 != pDVar1);
  }
  (this->super_BaseAction).status = COMPLETED;
  return;
}

Assistant:

void PrintMenu::act(Restaurant &restaurant)
{
    for (auto &i : restaurant.getMenu()) {
        std::cout << i.getName() << " " << findMyType(i.getType()) << " " << i.getPrice() << "NIS \n";
    }
    complete();
}